

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O3

void __thiscall
TimerManager::removeAgentsByReceiver(TimerManager *this,void *receiver,IEventDispatcher *dispatcher)

{
  ulong uVar1;
  AutoLock l;
  AutoLock AStack_38;
  
  AutoLock::AutoLock(&AStack_38,&this->mMutex);
  if ((this->mTimers).mSize != 0) {
    uVar1 = 0;
    do {
      Timer::removeAgentsByReceiver((this->mTimers).mData[uVar1],receiver,dispatcher);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (this->mTimers).mSize);
  }
  AutoLock::~AutoLock(&AStack_38);
  return;
}

Assistant:

void TimerManager::removeAgentsByReceiver( void* receiver,
										   IEventDispatcher* dispatcher )
{
	// Lock mutex while accessing/modifying mTimers vector
	AutoLock l(mMutex);
	
	for (unsigned i = 0; i < mTimers.size(); ++i)
	{
		mTimers[i]->removeAgentsByReceiver(receiver, dispatcher);
	}
}